

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer_block.cpp
# Opt level: O0

bool __thiscall
cppnet::BufferBlock::GetFreeMemoryBlock
          (BufferBlock *this,void **res1,uint32_t *len1,void **res2,uint32_t *len2)

{
  uint32_t *len2_local;
  void **res2_local;
  uint32_t *len1_local;
  void **res1_local;
  BufferBlock *this_local;
  
  *res2 = (void *)0x0;
  *res1 = (void *)0x0;
  *len2 = 0;
  *len1 = 0;
  if (this->_write < this->_read) {
    *res1 = this->_write;
    *len1 = (int)this->_read - (int)this->_write;
    this_local._7_1_ = true;
  }
  else if (((this->_can_read & 1U) == 0) || (this->_write != this->_read)) {
    *res1 = this->_write;
    *len1 = (int)this->_buffer_end - (int)this->_write;
    *len2 = (int)this->_read - (int)this->_buffer_start;
    if (*len2 != 0) {
      *res2 = this->_buffer_start;
    }
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool BufferBlock::GetFreeMemoryBlock(void*& res1, uint32_t& len1, void*& res2, uint32_t& len2) {
    res1 = res2 = nullptr;
    len1 = len2 = 0;

    if (_write >= _read) {
        if (_can_read && _write == _read) {
            return false;
        }
        res1 = _write;
        len1 = (uint32_t)(_buffer_end - _write);

        len2 = (uint32_t)(_read - _buffer_start);
        if(len2 > 0) {
            res2 = _buffer_start;
        }
        return true;

    } else {
        res1 = _write;
        len1 = (uint32_t)(_read - _write);
        return true;
    }
}